

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio.c
# Opt level: O2

uint32_t FAudioCOMConstructEXT(FAudio **ppFAudio,uint8_t version)

{
  FAudioCOMConstructWithCustomAllocatorEXT(ppFAudio,version,SDL_malloc,SDL_free,SDL_realloc);
  return 0;
}

Assistant:

uint32_t FAudioCOMConstructEXT(FAudio **ppFAudio, uint8_t version)
{
	return FAudioCOMConstructWithCustomAllocatorEXT(
		ppFAudio,
		version,
		FAudio_malloc,
		FAudio_free,
		FAudio_realloc
	);
}